

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bezier.cpp
# Opt level: O1

Color * __thiscall
Bezier::getColor(Color *__return_storage_ptr__,Bezier *this,double t,double theta)

{
  double dVar1;
  
  if ((this->super_Primitive).texture.data == (Vec3b *)0x0) {
    __return_storage_ptr__->z = (this->super_Primitive).color.z;
    dVar1 = (this->super_Primitive).color.y;
    __return_storage_ptr__->x = (this->super_Primitive).color.x;
    __return_storage_ptr__->y = dVar1;
  }
  else {
    if ((((t < -1e-05) || (dVar1 = (theta / ::PI) * 0.5 + 0.5, dVar1 < -1e-05)) ||
        ((-1e-05 <= t + -1.0 && (1e-05 < t + -1.0)))) ||
       ((-1e-05 <= dVar1 + -1.0 && (1e-05 < dVar1 + -1.0)))) {
      __assert_fail("sign(x) >= 0 && sign(y) >=0 && sign(x - 1) <= 0 && sign(y - 1) <= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Bezier.cpp"
                    ,0xc1,"Color Bezier::getColor(double, double)");
    }
    Picture::getColor(__return_storage_ptr__,&(this->super_Primitive).texture,t,dVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Color Bezier::getColor(double t, double theta)
{
    if (texture.data == NULL) return color;
    double x = t, y = theta / PI / 2 + 0.5;
#ifdef DEBUG
    assert(sign(x) >= 0 && sign(y) >=0 && sign(x - 1) <= 0 && sign(y - 1) <= 0);
#endif
    return texture.getColor(x, y);
}